

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

sample_type __thiscall
charls::jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>::
do_regular(jls_codec<charls::default_traits<unsigned_char,_unsigned_char>,_charls::encoder_strategy>
           *this,int32_t qs,int32_t x,int32_t predicted,encoder_strategy *param_4)

{
  default_traits<unsigned_char,_unsigned_char> *this_00;
  byte bVar1;
  uchar uVar2;
  int iVar3;
  int32_t k;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  context_regular_mode *this_01;
  uint uVar9;
  uint uVar10;
  
  uVar9 = qs >> 0x1f;
  iVar3 = -qs;
  if (0 < qs) {
    iVar3 = qs;
  }
  this_01 = (this->contexts_)._M_elems + iVar3;
  k = context_regular_mode::get_golomb_coding_parameter(this_01);
  this_00 = &this->traits_;
  uVar7 = 0;
  uVar4 = (((this->contexts_)._M_elems[iVar3].c_ ^ uVar9) - uVar9) + predicted;
  uVar5 = (this->traits_).maximum_sample_value;
  uVar10 = uVar5;
  if ((int)uVar4 < 0) {
    uVar10 = 0;
  }
  if ((uVar4 & ~uVar5) == 0) {
    uVar10 = uVar4;
  }
  uVar5 = default_traits<unsigned_char,_unsigned_char>::compute_error_value
                    (this_00,(x - uVar10 ^ uVar9) - uVar9);
  if ((this->traits_).near_lossless == 0 && k == 0) {
    uVar7 = (this->contexts_)._M_elems[iVar3].n_ + (this->contexts_)._M_elems[iVar3].b_ * 2 + -1 >>
            0x1f;
  }
  uVar7 = uVar7 ^ uVar5;
  if ((int)uVar7 < 0x40000000) {
    encode_mapped_value(this,k,uVar7 * 2 ^ (int)uVar7 >> 0x1e,(this->traits_).limit);
    context_regular_mode::update_variables_and_bias
              (this_01,uVar5,(this->traits_).near_lossless,(this->traits_).reset_threshold);
    iVar8 = (uVar5 ^ uVar9) - uVar9;
    bVar1 = default_traits<unsigned_char,_unsigned_char>::fix_reconstructed_value
                      (this_00,((this->traits_).near_lossless * 2 + 1) * iVar8 + uVar10);
    iVar6 = (uint)bVar1 - x;
    iVar3 = -iVar6;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
    iVar6 = (this->traits_).near_lossless;
    if (iVar3 <= iVar6) {
      uVar2 = default_traits<unsigned_char,_unsigned_char>::fix_reconstructed_value
                        (this_00,(iVar6 * 2 + 1) * iVar8 + uVar10);
      return uVar2;
    }
    __assert_fail("traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x15c,
                  "sample_type charls::jls_codec<charls::default_traits<unsigned char, unsigned char>, charls::encoder_strategy>::do_regular(const int32_t, const int32_t, const int32_t, encoder_strategy *) [Traits = charls::default_traits<unsigned char, unsigned char>, Strategy = charls::encoder_strategy]"
                 );
  }
  __assert_fail("error_value <= std::numeric_limits<int32_t>::max() / 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                ,0x51,"int32_t charls::map_error_value(const int32_t)");
}

Assistant:

do_regular(const int32_t qs, const int32_t x, const int32_t predicted,
                                        encoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};
        const int32_t error_value{traits_.compute_error_value(apply_sign(x - predicted_value, sign))};

        encode_mapped_value(k, map_error_value(context.get_error_correction(k | traits_.near_lossless) ^ error_value),
                            traits_.limit);
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        ASSERT(traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x));
        return static_cast<sample_type>(
            traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)));
    }